

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O3

bool efsw::Platform::FileSystem::isRemoteFS(string *directory)

{
  pointer pcVar1;
  bool bVar2;
  long lVar3;
  statfs statfsbuf;
  string local_b0;
  statfs local_90;
  
  statfs((directory->_M_dataplus)._M_p,&local_90);
  if (local_90.f_type < 0x65735543) {
    if (local_90.f_type < 0xbd00bd0) {
      if (local_90.f_type < 0x6969) {
        if (local_90.f_type == 0x517b) {
          return true;
        }
        if (local_90.f_type == 0x564c) {
          return true;
        }
      }
      else {
        if (local_90.f_type == 0x6969) {
          return true;
        }
        if (local_90.f_type == 0xc36400) {
          return true;
        }
        if (local_90.f_type == 0x1161970) {
          return true;
        }
      }
    }
    else if (local_90.f_type < 0x50495045) {
      if (local_90.f_type == 0xbd00bd0) {
        return true;
      }
      if (local_90.f_type == 0x19830326) {
        return true;
      }
      if (local_90.f_type == 0x47504653) {
        return true;
      }
    }
    else {
      if (local_90.f_type == 0x50495045) {
        return true;
      }
      if (local_90.f_type == 0x5346414f) {
        return true;
      }
      if (local_90.f_type == 0x61756673) {
        return true;
      }
    }
  }
  else if (local_90.f_type < 0x7461636f) {
    if (local_90.f_type < 0x6b414653) {
      if (local_90.f_type == 0x65735543) {
        return true;
      }
      if (local_90.f_type == 0x65735546) {
        pcVar1 = (directory->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar1,pcVar1 + directory->_M_string_length);
        bVar2 = isLocalFUSEDirectory(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
          return !bVar2;
        }
        operator_delete(local_b0._M_dataplus._M_p);
        return !bVar2;
      }
    }
    else {
      if (local_90.f_type == 0x6b414653) {
        return true;
      }
      if (local_90.f_type == 0x6e667364) {
        return true;
      }
      if (local_90.f_type == 0x73757245) {
        return true;
      }
    }
  }
  else {
    if (local_90.f_type < 0xbacbacbc) {
      if (local_90.f_type == 0x7461636f) {
        return true;
      }
      if (local_90.f_type == 0xa501fcf5) {
        return true;
      }
      lVar3 = 0xaad7aaea;
    }
    else {
      if (local_90.f_type == 0xbacbacbc) {
        return true;
      }
      if (local_90.f_type == 0xbeefdead) {
        return true;
      }
      lVar3 = 0xff534d42;
    }
    if (local_90.f_type == lVar3) {
      return true;
    }
  }
  return false;
}

Assistant:

bool FileSystem::isRemoteFS( const std::string& directory ) {
#if EFSW_OS == EFSW_OS_LINUX || EFSW_OS == EFSW_OS_MACOSX || EFSW_OS == EFSW_OS_BSD || \
	EFSW_OS == EFSW_OS_SOLARIS || EFSW_OS == EFSW_OS_ANDROID || EFSW_OS == EFSW_OS_IOS
	struct statfs statfsbuf;

	statfs( directory.c_str(), &statfsbuf );

	switch ( statfsbuf.f_type | 0UL ) {
		case S_MAGIC_FUSEBLK: /* 0x65735546 remote */
		{
#if EFSW_OS == EFSW_OS_LINUX
			return !isLocalFUSEDirectory( directory );
#endif
		}
		case S_MAGIC_AFS:	  /* 0x5346414F remote */
		case S_MAGIC_AUFS:	  /* 0x61756673 remote */
		case S_MAGIC_CEPH:	  /* 0x00C36400 remote */
		case S_MAGIC_CIFS:	  /* 0xFF534D42 remote */
		case S_MAGIC_CODA:	  /* 0x73757245 remote */
		case S_MAGIC_FHGFS:	  /* 0x19830326 remote */
		case S_MAGIC_FUSECTL: /* 0x65735543 remote */
		case S_MAGIC_GFS:	  /* 0x01161970 remote */
		case S_MAGIC_GPFS:	  /* 0x47504653 remote */
		case S_MAGIC_KAFS:	  /* 0x6B414653 remote */
		case S_MAGIC_LUSTRE:  /* 0x0BD00BD0 remote */
		case S_MAGIC_NCP:	  /* 0x564C remote */
		case S_MAGIC_NFS:	  /* 0x6969 remote */
		case S_MAGIC_NFSD:	  /* 0x6E667364 remote */
		case S_MAGIC_OCFS2:	  /* 0x7461636F remote */
		case S_MAGIC_PANFS:	  /* 0xAAD7AAEA remote */
		case S_MAGIC_PIPEFS:  /* 0x50495045 remote */
		case S_MAGIC_SMB:	  /* 0x517B remote */
		case S_MAGIC_SNFS:	  /* 0xBEEFDEAD remote */
		case S_MAGIC_VMHGFS:  /* 0xBACBACBC remote */
		case S_MAGIC_VXFS:	  /* 0xA501FCF5 remote */
		{
			return true;
		}
		default: {
			return false;
		}
	}
#endif

	return false;
}